

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QChar __thiscall QVariant::toChar(QVariant *this)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [8];
  QMetaType local_20 [2];
  
  local_20[1].d_ptr = *(QMetaTypeInterface **)(in_FS_OFFSET + 0x28);
  local_20[0].d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QChar>::metaType;
  local_28 = (undefined1  [8])(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual((QMetaType *)local_28,local_20);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar2->offset);
    }
  }
  else {
    local_28 = (undefined1  [8])((ulong)local_28 & 0xffffffffffff0000);
    uVar1 = *(ulong *)&(this->d).field_0x18;
    if ((uVar1 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar2->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar1 & 0xfffffffffffffffc),this,local_20[0],local_28)
    ;
    this = (QVariant *)local_28;
  }
  if ((QMetaTypeInterface *)*(long *)(in_FS_OFFSET + 0x28) != local_20[1].d_ptr) {
    __stack_chk_fail();
  }
  return (QChar)*(char16_t *)&(this->d).data;
}

Assistant:

QChar QVariant::toChar() const
{
    return qvariant_cast<QChar>(*this);
}